

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O3

shared_ptr<cppnet::Log> __thiscall cppnet::BaseLogger::GetLog(BaseLogger *this)

{
  element_type eVar1;
  bool bVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _func_int **in_RSI;
  shared_ptr<cppnet::Log> sVar4;
  Log *log;
  element_type local_20;
  
  local_20._vptr_Alloter = (_func_int **)0x0;
  bVar2 = ThreadSafeQueue<cppnet::Log_*>::Pop
                    ((ThreadSafeQueue<cppnet::Log_*> *)(in_RSI + 3),(Log **)&local_20);
  if (!bVar2) {
    local_20._vptr_Alloter =
         (_func_int **)
         (**(code **)(*(long *)in_RSI[1] + 0x18))(in_RSI[1],*(ushort *)((long)in_RSI + 4) + 0x10);
    *local_20._vptr_Alloter = (_func_int *)(local_20._vptr_Alloter + 2);
    *(uint *)(local_20._vptr_Alloter + 1) = (uint)*(ushort *)((long)in_RSI + 4);
  }
  eVar1._vptr_Alloter = local_20._vptr_Alloter;
  *(_func_int ***)this = local_20._vptr_Alloter;
  (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  peVar3 = (element_type *)operator_new(0x20);
  peVar3[1]._vptr_Alloter = (_func_int **)0x100000001;
  peVar3->_vptr_Alloter = (_func_int **)&PTR___Sp_counted_base_00133b20;
  peVar3[2]._vptr_Alloter = in_RSI;
  peVar3[3]._vptr_Alloter = eVar1._vptr_Alloter;
  (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  sVar4.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<cppnet::Log>)sVar4.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Log> BaseLogger::GetLog() {
    Log* log = nullptr;
    if (_cache_queue.Pop(log)) {

    } else {
        log = NewLog();
    }

    auto deleter = [this](Log *l) { FreeLog(l); };

    return std::shared_ptr<Log>(log, deleter);
}